

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O2

size_t duckdb_zstd::HUF_decompress4X2_usingDTable_internal_fast
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 HUF_DecompressFastLoopFn loopFn)

{
  BYTE *pBVar1;
  BYTE *pBVar2;
  long lVar3;
  long lVar4;
  BYTE *pStart;
  size_t sVar5;
  ulong uVar6;
  BYTE *pBVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  BIT_DStream_t local_108;
  size_t local_e0;
  ulong local_d8;
  BYTE *local_d0;
  HUF_DecompressFastArgs args;
  
  sVar5 = HUF_DecompressFastArgs_init(&args,dst,dstSize,cSrc,cSrcSize,DTable);
  if (sVar5 - 1 < 0xffffffffffffff88) {
    local_d0 = (BYTE *)((~((long)dstSize >> 0x3f) & dstSize) + (long)dst);
    HUF_decompress4X2_usingDTable_internal_fast_c_loop(&args);
    local_d8 = dstSize + 3 >> 2;
    lVar8 = 0;
    local_e0 = dstSize;
    do {
      if (lVar8 == 4) {
        return local_e0;
      }
      uVar6 = (long)local_d0 - (long)dst;
      dst = (BYTE *)((long)dst + local_d8);
      if (uVar6 < local_d8) {
        dst = local_d0;
      }
      sVar5 = HUF_initRemainingDStream(&local_108,&args,(int)lVar8,(BYTE *)dst);
      if (0xffffffffffffff88 < sVar5) {
        return sVar5;
      }
      pBVar1 = args.op[lVar8];
      uVar6 = (ulong)local_108.bitsConsumed;
      iVar10 = (int)local_108.start;
      pBVar7 = pBVar1;
      if ((ulong)((long)dst - (long)pBVar1) < 8) {
        if (local_108.bitsConsumed < 0x41) {
          if (local_108.ptr < local_108.limitPtr) {
            if (local_108.ptr == local_108.start) goto LAB_003d8da8;
            uVar9 = (int)local_108.ptr - iVar10;
            if (local_108.start <=
                (BitContainerType *)((long)local_108.ptr - (ulong)(local_108.bitsConsumed >> 3))) {
              uVar9 = local_108.bitsConsumed >> 3;
            }
            local_108.bitsConsumed = local_108.bitsConsumed + uVar9 * -8;
          }
          else {
            uVar9 = local_108.bitsConsumed >> 3;
            local_108.bitsConsumed = local_108.bitsConsumed & 7;
          }
          local_108.ptr = (char *)((long)local_108.ptr - (ulong)uVar9);
          uVar6 = (ulong)local_108.bitsConsumed;
          local_108.bitContainer = *(BitContainerType *)local_108.ptr;
        }
        else {
          local_108.ptr = "";
        }
      }
      else {
        while (local_108.bitsConsumed = (uint)uVar6, local_108.bitsConsumed < 0x41) {
          if (local_108.ptr < local_108.limitPtr) {
            if (local_108.ptr != local_108.start) {
              bVar13 = local_108.start <= (BitContainerType *)((long)local_108.ptr - (uVar6 >> 3));
              uVar9 = (int)local_108.ptr - iVar10;
              if (bVar13) {
                uVar9 = (uint)(uVar6 >> 3);
              }
              local_108.bitsConsumed = local_108.bitsConsumed + uVar9 * -8;
              goto LAB_003d8c55;
            }
LAB_003d8d7b:
            local_108.bitsConsumed = (uint)uVar6;
            goto LAB_003d8da8;
          }
          uVar9 = (uint)(uVar6 >> 3);
          local_108.bitsConsumed = local_108.bitsConsumed & 7;
          bVar13 = true;
LAB_003d8c55:
          uVar6 = (ulong)local_108.bitsConsumed;
          local_108.ptr = (char *)((long)local_108.ptr - (ulong)uVar9);
          local_108.bitContainer = *(BitContainerType *)local_108.ptr;
          if (((BYTE *)((long)dst + -9) <= pBVar7) || (!bVar13)) goto LAB_003d8d7b;
          uVar6 = (local_108.bitContainer << (uVar6 & 0x3f)) >> 0x35;
          *(short *)pBVar7 = (short)DTable[uVar6 + 1];
          local_108.bitsConsumed = *(byte *)((long)DTable + uVar6 * 4 + 6) + local_108.bitsConsumed;
          uVar6 = (ulong)*(byte *)((long)DTable + uVar6 * 4 + 7);
          uVar12 = (local_108.bitContainer << ((ulong)local_108.bitsConsumed & 0x3f)) >> 0x35;
          *(short *)(pBVar7 + uVar6) = (short)DTable[uVar12 + 1];
          local_108.bitsConsumed = *(byte *)((long)DTable + uVar12 * 4 + 6) + local_108.bitsConsumed
          ;
          uVar12 = (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7);
          lVar3 = uVar12 + uVar6;
          uVar11 = (local_108.bitContainer << ((ulong)local_108.bitsConsumed & 0x3f)) >> 0x35;
          *(short *)(pBVar7 + uVar12 + uVar6) = (short)DTable[uVar11 + 1];
          local_108.bitsConsumed = *(byte *)((long)DTable + uVar11 * 4 + 6) + local_108.bitsConsumed
          ;
          uVar6 = (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7);
          lVar4 = uVar6 + lVar3;
          uVar12 = (local_108.bitContainer << ((ulong)local_108.bitsConsumed & 0x3f)) >> 0x35;
          *(short *)(pBVar7 + uVar6 + lVar3) = (short)DTable[uVar12 + 1];
          local_108.bitsConsumed = *(byte *)((long)DTable + uVar12 * 4 + 6) + local_108.bitsConsumed
          ;
          uVar6 = (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7);
          uVar12 = (local_108.bitContainer << ((ulong)local_108.bitsConsumed & 0x3f)) >> 0x35;
          *(short *)(pBVar7 + uVar6 + lVar4) = (short)DTable[uVar12 + 1];
          pBVar7 = pBVar7 + (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7) + uVar6 + lVar4;
          uVar6 = (ulong)(*(byte *)((long)DTable + uVar12 * 4 + 6) + local_108.bitsConsumed);
        }
        local_108.ptr = "";
      }
LAB_003d8da8:
      if (1 < (ulong)((long)dst - (long)pBVar7)) {
        while (uVar9 = (uint)uVar6, uVar9 < 0x41) {
          if (local_108.ptr < local_108.limitPtr) {
            if (local_108.ptr == local_108.start) goto LAB_003d8eb2;
            bVar13 = local_108.start <= (BitContainerType *)((long)local_108.ptr - (uVar6 >> 3));
            uVar12 = (ulong)(uint)((int)local_108.ptr - iVar10);
            if (bVar13) {
              uVar12 = uVar6 >> 3;
            }
            local_108.bitsConsumed = uVar9 + (int)uVar12 * -8;
          }
          else {
            uVar12 = uVar6 >> 3;
            local_108.bitsConsumed = uVar9 & 7;
            bVar13 = true;
          }
          local_108.ptr = (char *)((long)local_108.ptr - uVar12);
          uVar6 = (ulong)local_108.bitsConsumed;
          local_108.bitContainer = *(BitContainerType *)local_108.ptr;
          if (((BYTE *)((long)dst + -2) < pBVar7) || (!bVar13)) goto LAB_003d8eb2;
          uVar6 = (local_108.bitContainer << (uVar6 & 0x3f)) >> 0x35;
          *(short *)pBVar7 = (short)DTable[uVar6 + 1];
          local_108.bitsConsumed = *(byte *)((long)DTable + uVar6 * 4 + 6) + local_108.bitsConsumed;
          pBVar7 = pBVar7 + *(byte *)((long)DTable + uVar6 * 4 + 7);
          uVar6 = (ulong)local_108.bitsConsumed;
        }
        local_108.ptr = "";
LAB_003d8eb2:
        for (; pBVar7 <= (BYTE *)((long)dst + -2);
            pBVar7 = pBVar7 + *(byte *)((long)DTable + uVar12 * 4 + 7)) {
          uVar12 = (local_108.bitContainer << (uVar6 & 0x3f)) >> 0x35;
          *(short *)pBVar7 = (short)DTable[uVar12 + 1];
          local_108.bitsConsumed = *(byte *)((long)DTable + uVar12 * 4 + 6) + local_108.bitsConsumed
          ;
          uVar6 = (ulong)local_108.bitsConsumed;
        }
      }
      if (pBVar7 < dst) {
        *pBVar7 = (BYTE)DTable[((local_108.bitContainer << (uVar6 & 0x3f)) >> 0x35) + 1];
        pBVar7 = pBVar7 + 1;
      }
      pBVar2 = args.op[lVar8];
      args.op[lVar8] = pBVar7 + ((long)pBVar2 - (long)pBVar1);
      lVar8 = lVar8 + 1;
    } while (pBVar7 + ((long)pBVar2 - (long)pBVar1) == (BYTE *)dst);
    sVar5 = 0xffffffffffffffec;
  }
  return sVar5;
}

Assistant:

static HUF_FAST_BMI2_ATTRS size_t
HUF_decompress4X2_usingDTable_internal_fast(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable,
    HUF_DecompressFastLoopFn loopFn) {
    void const* dt = DTable + 1;
    const BYTE* const ilowest = (const BYTE*)cSrc;
    BYTE* const oend = ZSTD_maybeNullPtrAdd((BYTE*)dst, dstSize);
    HUF_DecompressFastArgs args;
    {
        size_t const ret = HUF_DecompressFastArgs_init(&args, dst, dstSize, cSrc, cSrcSize, DTable);
        FORWARD_IF_ERROR(ret, "Failed to init asm args");
        if (ret == 0)
            return 0;
    }

    assert(args.ip[0] >= args.ilowest);
    loopFn(&args);

    /* note : op4 already verified within main loop */
    assert(args.ip[0] >= ilowest);
    assert(args.ip[1] >= ilowest);
    assert(args.ip[2] >= ilowest);
    assert(args.ip[3] >= ilowest);
    assert(args.op[3] <= oend);

    assert(ilowest == args.ilowest);
    assert(ilowest + 6 == args.iend[0]);
    (void)ilowest;

    /* finish bitStreams one by one */
    {
        size_t const segmentSize = (dstSize+3) / 4;
        BYTE* segmentEnd = (BYTE*)dst;
        int i;
        for (i = 0; i < 4; ++i) {
            BIT_DStream_t bit;
            if (segmentSize <= (size_t)(oend - segmentEnd))
                segmentEnd += segmentSize;
            else
                segmentEnd = oend;
            FORWARD_IF_ERROR(HUF_initRemainingDStream(&bit, &args, i, segmentEnd), "corruption");
            args.op[i] += HUF_decodeStreamX2(args.op[i], &bit, segmentEnd, (HUF_DEltX2 const*)dt, HUF_DECODER_FAST_TABLELOG);
            if (args.op[i] != segmentEnd)
                return ERROR(corruption_detected);
        }
    }

    /* decoded size */
    return dstSize;
}